

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# well.hpp
# Opt level: O1

result_type __thiscall
Well<unsigned_int,_32UL,_16UL,_0UL,_13UL,_9UL,_5UL,_Detail::M3<-16>,_Detail::M3<-15>,_Detail::M3<11>,_Detail::M0,_Detail::M3<-2>,_Detail::M3<-18>,_Detail::M2<-28>,_Detail::M5<-5,_3661901092U>,_Detail::NoTempering>
::operator()(Well<unsigned_int,_32UL,_16UL,_0UL,_13UL,_9UL,_5UL,_Detail::M3<_16>,_Detail::M3<_15>,_Detail::M3<11>,_Detail::M0,_Detail::M3<_2>,_Detail::M3<_18>,_Detail::M2<_28>,_Detail::M5<_5,_3661901092U>,_Detail::NoTempering>
             *this)

{
  size_t sVar1;
  int iVar2;
  uint uVar3;
  ulong uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  
  sVar1 = this->index_;
  iVar2 = (int)sVar1;
  uVar4 = (ulong)(iVar2 - 1U & 0xf);
  uVar3 = this->state_[uVar4];
  uVar7 = this->state_[sVar1] << 0x10 ^ this->state_[sVar1] ^ this->state_[iVar2 + 0xdU & 0xf];
  uVar6 = this->state_[iVar2 + 9U & 0xf] >> 0xb ^ this->state_[iVar2 + 9U & 0xf];
  uVar5 = this->state_[iVar2 + 0xdU & 0xf] << 0xf ^ uVar7 ^ uVar6;
  this->state_[sVar1] = uVar5;
  uVar3 = (uVar5 & 0x6d22169) << 5 ^ uVar6 << 0x1c ^ uVar3 * 4 ^ uVar7 << 0x12 ^ uVar3 ^ uVar6;
  this->state_[uVar4] = uVar3;
  this->index_ = uVar4;
  return uVar3;
}

Assistant:

result_type operator()()
    {
        const UIntType upper_mask = ~0U << p;
        const UIntType lower_mask = ~upper_mask;

        // v[i,j] = state[(r-i+j) mod r]
        std::size_t i = index_;
        // Equivalent to r-i but allows to avoid negative values in the
        // following two expressions
        std::size_t j = i + r;
        std::size_t k = mod(j - 1); // [i,r-1]
        std::size_t l = mod(j - 2); // [i,r-2]

        std::size_t im1 = i + m1;
        std::size_t im2 = i + m2;
        std::size_t im3 = i + m3;

        UIntType z0, z1, z2, z3, z4;

        z0 = (state_[k] & upper_mask) | (state_[l] & lower_mask);
        z1 = T0::transform(state_[i]) ^
             T1::transform(state(im1));
        z2 = T2::transform(state(im2)) ^
             T3::transform(state(im3));
        z3 = z1 ^ z2;
        z4 = T4::transform(z0) ^ T5::transform(z1) ^
             T6::transform(z2) ^ T7::transform(z3);

        state_[i] = z3; // v[i+1,1]
        state_[k] = z4; // v[i+1,0]

        index_ = k;

        return Tempering::template apply<r>(z4, state_, im2);
    }